

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O1

cmpResult __thiscall llvm::APFloat::compareAbsoluteValue(APFloat *this,APFloat *RHS)

{
  byte bVar1;
  fltSemantics *pfVar2;
  fltSemantics *pfVar3;
  uint uVar4;
  cmpResult cVar5;
  Significand *rhs;
  Significand *lhs;
  
  if ((this->U).semantics != (RHS->U).semantics) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only compare APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x33b,"cmpResult llvm::APFloat::compareAbsoluteValue(const APFloat &) const");
  }
  if ((this->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    cVar5 = detail::DoubleAPFloat::compareAbsoluteValue
                      ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(RHS->U).IEEE);
    return cVar5;
  }
  pfVar2 = (this->U).IEEE.semantics;
  pfVar3 = (RHS->U).IEEE.semantics;
  if (pfVar2 != pfVar3) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4a8,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  bVar1 = *(byte *)((long)&this->U + 0x12);
  if (((bVar1 & 6) != 0) && ((bVar1 & 7) != 3)) {
    bVar1 = *(byte *)((long)&RHS->U + 0x12);
    if (((bVar1 & 6) != 0) && ((bVar1 & 7) != 3)) {
      uVar4 = (int)(this->U).IEEE.exponent - (int)(RHS->U).IEEE.exponent;
      if (uVar4 == 0) {
        uVar4 = pfVar2->precision;
        if (uVar4 - 0x40 < 0xffffff80) {
          lhs = (Significand *)(this->U).IEEE.significand.parts;
        }
        else {
          lhs = &(this->U).IEEE.significand;
        }
        if (pfVar3->precision - 0x40 < 0xffffff80) {
          rhs = (Significand *)(RHS->U).IEEE.significand.parts;
        }
        else {
          rhs = &(RHS->U).IEEE.significand;
        }
        uVar4 = APInt::tcCompare(&lhs->part,&rhs->part,uVar4 + 0x40 >> 6);
      }
      cVar5 = cmpGreaterThan;
      if ((int)uVar4 < 1) {
        cVar5 = ~uVar4 >> 0x1f;
      }
      return cVar5;
    }
    __assert_fail("rhs.isFiniteNonZero()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4aa,
                  "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
                 );
  }
  __assert_fail("isFiniteNonZero()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x4a9,
                "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compareAbsoluteValue(const IEEEFloat &) const"
               );
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }